

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardPass.cpp
# Opt level: O1

void __thiscall BackwardPass::InsertTypeTransitionsAtPotentialKills(BackwardPass *this)

{
  int iVar1;
  int symId;
  Instr *this_00;
  JitArenaAllocator *pJVar2;
  BasicBlock *pBVar3;
  code *pcVar4;
  undefined8 this_01;
  bool bVar5;
  undefined4 *puVar6;
  Type *pTVar7;
  BasicBlock *pBVar8;
  ulong uVar9;
  AddPropertyCacheBucket *data_1;
  HashTable<AddPropertyCacheBucket,_Memory::ArenaAllocator> *pHVar10;
  BackwardPass *this_02;
  AddPropertyCacheBucket *data;
  JITTypeHolderBase<void> local_78;
  JITTypeHolderBase<void> local_70;
  BackwardPass *local_68;
  BasicBlock *local_60;
  undefined1 local_58 [24];
  undefined1 local_40 [8];
  Iterator __iter;
  
  this_00 = this->currentInstr;
  local_68 = this;
  if (((this_00->field_0x38 & 0x10) == 0) && (this_00->m_opcode != UpdateNewScObjectCache)) {
    local_58._16_8_ = IR::Instr::GetPropertySymOpnd(this_00);
    if (((BackwardPass *)local_58._16_8_ != (BackwardPass *)0x0) &&
       (bVar5 = IR::PropertySymOpnd::IsObjectHeaderInlined((PropertySymOpnd *)local_58._16_8_),
       bVar5)) {
      pJVar2 = *(JitArenaAllocator **)(local_58._16_8_ + 0x10);
      if (*(SymKind *)
           ((long)&(pJVar2->super_ArenaAllocator).
                   super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.
                   super_ArenaData.bigBlocks + 4) != SymKindProperty) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar6 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                           ,0x43,"(this->IsPropertySym())","Bad call to AsPropertySym()");
        if (!bVar5) {
LAB_003e2f19:
          pcVar4 = (code *)invalidInstructionException();
          (*pcVar4)();
        }
        *puVar6 = 0;
      }
      pBVar3 = local_68->currentBlock;
      pHVar10 = pBVar3->stackSymToFinalType;
      if ((pHVar10 != (HashTable<AddPropertyCacheBucket,_Memory::ArenaAllocator> *)0x0) &&
         (pHVar10->tableSize != 0)) {
        iVar1 = *(int *)&(pJVar2->super_ArenaAllocator).
                         super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.
                         super_ArenaData.mallocBlocks[1].field_0;
        pBVar8 = (BasicBlock *)__tls_get_addr(&PTR_0155fe48);
        uVar9 = 0;
        local_60 = pBVar8;
        do {
          local_40 = (undefined1  [8])(pHVar10->table + uVar9);
          __iter.list = (SListBase<Bucket<AddPropertyCacheBucket>,_Memory::ArenaAllocator,_RealCount>
                         *)local_40;
LAB_003e2da3:
          if (__iter.list ==
              (SListBase<Bucket<AddPropertyCacheBucket>,_Memory::ArenaAllocator,_RealCount> *)0x0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *(undefined4 *)&pBVar8->next = 1;
            bVar5 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                               ,0x76,"(current != nullptr)","current != nullptr");
            if (!bVar5) goto LAB_003e2f19;
            *(undefined4 *)&pBVar8->next = 0;
          }
          __iter.list = (SListBase<Bucket<AddPropertyCacheBucket>,_Memory::ArenaAllocator,_RealCount>
                         *)((__iter.list)->super_SListNodeBase<Memory::ArenaAllocator>).next;
          if ((undefined1  [8])__iter.list != local_40) {
            pTVar7 = SListBase<Bucket<AddPropertyCacheBucket>,_Memory::ArenaAllocator,_RealCount>::
                     Iterator::Data((Iterator *)local_40);
            local_58._0_8_ = (pTVar7->element).initialType.t;
            local_58._8_8_ = (GlobOpt *)0x0;
            bVar5 = JITTypeHolderBase<void>::operator!=
                              ((JITTypeHolderBase<void> *)local_58,(nullptr_t *)(local_58 + 8));
            if (bVar5) {
              local_78.t = (pTVar7->element).initialType.t;
              local_70.t = (pTVar7->element).finalType.t;
              bVar5 = JITTypeHolderBase<void>::operator!=(&local_78,&local_70);
              this_01 = local_58._16_8_;
              if ((bVar5) && (symId = pTVar7->value, iVar1 != symId)) {
                this_02 = (BackwardPass *)local_58._16_8_;
                bVar5 = IR::PropertySymOpnd::NeedsMonoCheck((PropertySymOpnd *)local_58._16_8_);
                if (bVar5) {
                  local_58._0_8_ = (pTVar7->element).initialType.t;
                  local_58._8_8_ = IR::PropertySymOpnd::GetType((PropertySymOpnd *)this_01);
                  this_02 = (BackwardPass *)local_58;
                  bVar5 = JITTypeHolderBase<void>::operator!=
                                    ((JITTypeHolderBase<void> *)this_02,
                                     (JITTypeHolderBase<void> *)(local_58 + 8));
                  pBVar8 = local_60;
                  if (bVar5) goto LAB_003e2da3;
                }
                pBVar8 = local_60;
                bVar5 = TransitionUndoesObjectHeaderInlining(this_02,&pTVar7->element);
                if (bVar5) {
                  InsertTypeTransitionAfterInstr
                            (local_68,this_00,symId,&pTVar7->element,
                             local_68->currentBlock->upwardExposedUses);
                }
              }
            }
            goto LAB_003e2da3;
          }
          uVar9 = uVar9 + 1;
          pHVar10 = pBVar3->stackSymToFinalType;
        } while (uVar9 < pHVar10->tableSize);
      }
    }
  }
  else {
    local_60 = this->currentBlock;
    pHVar10 = local_60->stackSymToFinalType;
    if ((pHVar10 != (HashTable<AddPropertyCacheBucket,_Memory::ArenaAllocator> *)0x0) &&
       (pHVar10->tableSize != 0)) {
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      local_58._16_8_ = (BackwardPass *)0x0;
      do {
        local_40 = (undefined1  [8])(pHVar10->table + local_58._16_8_);
        __iter.list = (SListBase<Bucket<AddPropertyCacheBucket>,_Memory::ArenaAllocator,_RealCount>
                       *)local_40;
        while( true ) {
          if (__iter.list ==
              (SListBase<Bucket<AddPropertyCacheBucket>,_Memory::ArenaAllocator,_RealCount> *)0x0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar6 = 1;
            bVar5 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                               ,0x76,"(current != nullptr)","current != nullptr");
            if (!bVar5) goto LAB_003e2f19;
            *puVar6 = 0;
          }
          __iter.list = (SListBase<Bucket<AddPropertyCacheBucket>,_Memory::ArenaAllocator,_RealCount>
                         *)((__iter.list)->super_SListNodeBase<Memory::ArenaAllocator>).next;
          if ((undefined1  [8])__iter.list == local_40) break;
          pTVar7 = SListBase<Bucket<AddPropertyCacheBucket>,_Memory::ArenaAllocator,_RealCount>::
                   Iterator::Data((Iterator *)local_40);
          local_58._0_8_ = (pTVar7->element).initialType.t;
          local_58._8_8_ = (GlobOpt *)0x0;
          bVar5 = JITTypeHolderBase<void>::operator!=
                            ((JITTypeHolderBase<void> *)local_58,(nullptr_t *)(local_58 + 8));
          if (bVar5) {
            local_78.t = (pTVar7->element).initialType.t;
            local_70.t = (pTVar7->element).finalType.t;
            bVar5 = JITTypeHolderBase<void>::operator!=(&local_78,&local_70);
            if (bVar5) {
              InsertTypeTransitionAfterInstr
                        (local_68,this_00,pTVar7->value,&pTVar7->element,
                         local_68->currentBlock->upwardExposedUses);
            }
          }
        }
        local_58._16_8_ = (long)&(((SymOpnd *)local_58._16_8_)->super_Opnd)._vptr_Opnd + 1;
        pHVar10 = local_60->stackSymToFinalType;
      } while ((ulong)local_58._16_8_ < (BackwardPass *)(ulong)pHVar10->tableSize);
    }
  }
  return;
}

Assistant:

void
BackwardPass::InsertTypeTransitionsAtPotentialKills()
{
    // Final types can't be pushed up past certain instructions.
    IR::Instr *instr = this->currentInstr;

    if (instr->HasBailOutInfo() || instr->m_opcode == Js::OpCode::UpdateNewScObjectCache)
    {
        // Final types can't be pushed up past a bailout point.
        // Insert any transitions called for by the current state of add-property buckets.
        // Also do this for ctor cache updates, to avoid putting a type in the ctor cache that extends past
        // the end of the ctor that the cache covers.
        this->ForEachAddPropertyCacheBucket([&](int symId, AddPropertyCacheBucket *data)->bool {
            this->InsertTypeTransitionAfterInstr(instr, symId, data, this->currentBlock->upwardExposedUses);
            return false;
        });
    }
    else
    {
        // If this is a load/store that expects an object-header-inlined type, don't push another sym's transition from
        // object-header-inlined to non-object-header-inlined type past it, because the two syms may be aliases.
        IR::PropertySymOpnd *propertySymOpnd = instr->GetPropertySymOpnd();
        if (propertySymOpnd && propertySymOpnd->IsObjectHeaderInlined())
        {
            SymID opndId = propertySymOpnd->m_sym->AsPropertySym()->m_stackSym->m_id;
            this->ForEachAddPropertyCacheBucket([&](int symId, AddPropertyCacheBucket *data)->bool {
                if ((SymID)symId == opndId)
                {
                    // This is the sym we're tracking. No aliasing to worry about.
                    return false;
                }
                if (propertySymOpnd->NeedsMonoCheck() && data->GetInitialType() != propertySymOpnd->GetType())
                {
                    // Type mismatch in a monomorphic case -- no aliasing.
                    return false;
                }
                if (this->TransitionUndoesObjectHeaderInlining(data))
                {
                    // We're transitioning from inlined to non-inlined, so we can't push it up any farther.
                    this->InsertTypeTransitionAfterInstr(instr, symId, data, this->currentBlock->upwardExposedUses);
                }
                return false;
            });
        }
    }
}